

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert(string *v,RepType *r)

{
  uint uVar1;
  allocator_type *__a;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  StringTokenizer *pSVar3;
  RealType v_1;
  uint i;
  uint size;
  StringTokenizer tokenizer;
  StringTokenizer *in_stack_ffffffffffffff00;
  StringTokenizer *in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *this;
  undefined4 in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff3c;
  StringTokenizer *in_stack_ffffffffffffff40;
  StringTokenizer *this_00;
  allocator<char> local_89;
  string local_88 [120];
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  std::operator<<((ostream *)&std::cerr,"calling tokenizer\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffff40->tokenString_,
             (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (allocator<char> *)in_stack_ffffffffffffff30);
  OpenMD::StringTokenizer::StringTokenizer
            (in_stack_ffffffffffffff40,
             (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  uVar1 = OpenMD::StringTokenizer::countTokens(in_stack_ffffffffffffff10);
  __a = (allocator_type *)(ulong)uVar1;
  this_00 = (StringTokenizer *)0x0;
  this = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff3f;
  uVar4 = uVar1;
  std::allocator<double>::allocator((allocator<double> *)0x28df08);
  std::vector<double,_std::allocator<double>_>::vector
            (in_RDI,CONCAT44(uVar4,in_stack_ffffffffffffff18),(value_type_conflict *)this,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            (this,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::allocator<double>::~allocator((allocator<double> *)0x28df49);
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pSVar3 = (StringTokenizer *)OpenMD::StringTokenizer::nextTokenAsDouble(this_00);
    in_stack_ffffffffffffff00 = pSVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(ulong)uVar4);
    *pvVar2 = (value_type)pSVar3;
  }
  OpenMD::StringTokenizer::~StringTokenizer(in_stack_ffffffffffffff00);
  return true;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    std::cerr << "calling tokenizer\n";
    OpenMD::StringTokenizer tokenizer(v, " ();,\t\n\r");
    unsigned int size = tokenizer.countTokens();
    r                 = std::vector<RealType>(size, 0.0);
    for (unsigned int i = 0; i < size; i++) {
      RealType v = tokenizer.nextTokenAsDouble();
      r[i]       = v;
    }
    return true;
  }